

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.hpp
# Opt level: O0

void __thiscall Propagator::add_to_propagator(Propagator *this,uint y,uint x,uint pattern)

{
  array<int,_4UL> *paVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  size_t in_RDI;
  array<int,_4UL> temp;
  size_t in_stack_ffffffffffffffc8;
  uint *__args_2;
  uint *__args_1;
  undefined4 in_stack_ffffffffffffffe8;
  
  __args_2 = (uint *)0x0;
  __args_1 = (uint *)0x0;
  paVar1 = Array3D<std::array<int,_4UL>_>::get
                     ((Array3D<std::array<int,_4UL>_> *)0x0,0,in_RDI,in_stack_ffffffffffffffc8);
  *(uint **)paVar1->_M_elems = __args_2;
  *(uint **)(paVar1->_M_elems + 2) = __args_1;
  std::
  vector<std::tuple<unsigned_int,unsigned_int,unsigned_int>,std::allocator<std::tuple<unsigned_int,unsigned_int,unsigned_int>>>
  ::emplace_back<unsigned_int&,unsigned_int&,unsigned_int&>
            ((vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
              *)CONCAT44(in_ESI,in_EDX),(uint *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),__args_1,
             __args_2);
  return;
}

Assistant:

void add_to_propagator(unsigned y, unsigned x, unsigned pattern) noexcept {
    // All the direction are set to 0, since the pattern cannot be set in (y,x).
    std::array<int, 4> temp = {};
    compatible.get(y, x, pattern) = temp;
    propagating.emplace_back(y, x, pattern);
  }